

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O2

uint64_t __thiscall llvm::hashing::detail::hash_state::finalize(hash_state *this,size_t length)

{
  ulong uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  
  uVar2 = hash_16_bytes(this->h3,this->h5);
  uVar1 = this->h1;
  uVar4 = this->h2;
  uVar3 = hash_16_bytes(this->h4,this->h6);
  uVar4 = hash_16_bytes((uVar1 >> 0x2f ^ uVar1) * -0x4b6d499041670d8d + uVar2 + uVar4,
                        (length >> 0x2f ^ length) * -0x4b6d499041670d8d + uVar3 + this->h0);
  return uVar4;
}

Assistant:

uint64_t finalize(size_t length) {
    return hash_16_bytes(hash_16_bytes(h3, h5) + shift_mix(h1) * k1 + h2,
                         hash_16_bytes(h4, h6) + shift_mix(length) * k1 + h0);
  }